

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O3

size_t cmCTestSubmitHandlerWriteMemoryCallback(void *ptr,size_t size,size_t nmemb,void *data)

{
  size_t sVar1;
  
  sVar1 = (size_t)((int)size * (int)nmemb);
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)data,*(undefined8 *)((long)data + 8),ptr,
             (long)ptr + sVar1);
  return sVar1;
}

Assistant:

static size_t cmCTestSubmitHandlerWriteMemoryCallback(void* ptr, size_t size,
                                                      size_t nmemb, void* data)
{
  int realsize = static_cast<int>(size * nmemb);
  const char* chPtr = static_cast<char*>(ptr);
  cm::append(*static_cast<cmCTestSubmitHandlerVectorOfChar*>(data), chPtr,
             chPtr + realsize);
  return realsize;
}